

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O1

bool __thiscall ON_Line::InPlane(ON_Line *this,ON_Plane *plane,double tolerance)

{
  bool bVar1;
  ON_3dVector *pOVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ON_3dVector X;
  ON_3dVector Y;
  ON_3dVector v;
  ON_3dVector local_b8;
  ON_3dVector local_98;
  double local_78;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  ON_3dVector local_38;
  
  local_78 = tolerance;
  ON_3dPoint::operator-(&local_38,&this->to,&this->from);
  dVar5 = ABS(local_38.x);
  dVar4 = ABS(local_38.y);
  dVar3 = ABS(local_38.z);
  if ((local_78 < dVar3) || (dVar4 <= local_78 && dVar5 <= local_78)) {
    if ((local_78 < dVar5) || (dVar4 <= local_78 && dVar3 <= local_78)) {
      if ((local_78 < dVar4) || (dVar3 <= local_78 && dVar5 <= local_78)) {
        uStack_50 = 0;
        uStack_60 = 0;
        local_b8.z = local_38.z;
        local_b8.x = local_38.x;
        local_b8.y = local_38.y;
        uStack_40 = 0;
        local_68 = dVar3;
        local_58 = dVar4;
        local_48 = dVar5;
        ON_3dVector::Unitize(&local_b8);
        ON_3dVector::PerpendicularTo(&local_98,&local_b8);
        bVar1 = true;
        if ((local_48 <= local_78) && ((local_58 <= local_78 && (local_68 <= local_78)))) {
          bVar1 = ON_3dVector::IsZero(&local_b8);
          if (bVar1) {
            local_b8.z = ON_3dVector::XAxis.z;
            local_b8.x = ON_3dVector::XAxis.x;
            local_b8.y = ON_3dVector::XAxis.y;
            local_98.x = ON_3dVector::YAxis.x;
            local_98.y = ON_3dVector::YAxis.y;
            local_98.z = ON_3dVector::YAxis.z;
          }
          bVar1 = false;
        }
        goto LAB_004ccaab;
      }
      local_b8.z = ON_3dVector::ZAxis.z;
      local_b8.x = ON_3dVector::ZAxis.x;
      local_b8.y = ON_3dVector::ZAxis.y;
      pOVar2 = &ON_3dVector::XAxis;
    }
    else {
      local_b8.z = ON_3dVector::YAxis.z;
      local_b8.x = ON_3dVector::YAxis.x;
      local_b8.y = ON_3dVector::YAxis.y;
      pOVar2 = &ON_3dVector::ZAxis;
    }
  }
  else {
    local_b8.z = ON_3dVector::XAxis.z;
    local_b8.x = ON_3dVector::XAxis.x;
    local_b8.y = ON_3dVector::XAxis.y;
    pOVar2 = &ON_3dVector::YAxis;
  }
  local_98.x = pOVar2->x;
  local_98.y = pOVar2->y;
  local_98.z = pOVar2->z;
  bVar1 = true;
LAB_004ccaab:
  ON_Plane::CreateFromFrame(plane,&this->from,&local_b8,&local_98);
  return bVar1;
}

Assistant:

bool ON_Line::InPlane( ON_Plane& plane, double tolerance ) const
{
  const ON_3dVector v = to-from;
  const bool bTinyX = fabs(v.x) <= tolerance;
  const bool bTinyY = fabs(v.y) <= tolerance;
  const bool bTinyZ = fabs(v.z) <= tolerance;
  bool rc = true;
  ON_3dVector X;
  ON_3dVector Y;
  if ( bTinyZ && ( !bTinyX || !bTinyY ) )
  {
    X = ON_3dVector::XAxis;
    Y = ON_3dVector::YAxis;
  }
  else if ( bTinyX && ( !bTinyY || !bTinyZ ) )
  {
    X = ON_3dVector::YAxis;
    Y = ON_3dVector::ZAxis;
  }
  else if ( bTinyY && ( !bTinyZ || !bTinyX ) )
  {
    X = ON_3dVector::ZAxis;
    Y = ON_3dVector::XAxis;
  }
  else
  {
    X = v;
    X.Unitize();
    Y.PerpendicularTo(X);
    if ( bTinyX && bTinyY && bTinyZ )
    {
      rc = false;
      if ( X.IsZero() )
      {
        X = ON_3dVector::XAxis;
        Y = ON_3dVector::YAxis;
      }
    }
  }
  plane.CreateFromFrame( from, X, Y );
  return rc;
}